

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O1

partial_ordering __thiscall phosg::JSON::operator<=>(JSON *this,dict_type *v)

{
  partial_ordering pVar1;
  const_iterator cVar2;
  __node_base *p_Var3;
  undefined1 auVar4 [12];
  
  if ((*(__index_type *)
        ((long)&(this->value).
                super__Variant_base<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
                .
                super__Move_assign_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
                .
                super__Copy_assign_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
                .
                super__Move_ctor_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
                .
                super__Copy_ctor_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
                .
                super__Variant_storage_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
        + 0x38) == '\x06') &&
     (*(size_type *)
       ((long)&(this->value).
               super__Variant_base<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
               .
               super__Move_assign_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
               .
               super__Copy_assign_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
               .
               super__Move_ctor_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
               .
               super__Copy_ctor_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
               .
               super__Variant_storage_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
               ._M_u + 0x18) == (v->_M_h)._M_element_count)) {
    p_Var3 = &(v->_M_h)._M_before_begin;
    do {
      p_Var3 = p_Var3->_M_nxt;
      if (p_Var3 == (__node_base *)0x0) {
        return (partial_ordering)'\0';
      }
      cVar2 = ::std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)this,(key_type *)(p_Var3 + 1));
      if (cVar2.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        auVar4 = ::std::__throw_out_of_range("_Map_base::at");
        if (auVar4._8_4_ != 1) {
          _Unwind_Resume(auVar4._0_8_);
        }
        __cxa_begin_catch();
        __cxa_end_catch();
        return (partial_ordering)'\x02';
      }
      pVar1 = operator<=>(*(JSON **)((long)cVar2.
                                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>,_true>
                                           ._M_cur + 0x28),(JSON *)p_Var3[5]._M_nxt);
    } while (pVar1._M_value == '\0');
  }
  return (partial_ordering)'\x02';
}

Assistant:

partial_ordering JSON::operator<=>(const dict_type& v) const {
  const dict_type* stored_v = get_if<6>(&this->value);
  if (stored_v == nullptr) {
    return partial_ordering::unordered;
  }
  // If the dict sizes are equal and all key/value pairs match, then the overall
  // result is equality; otherwise, it's inequality. There is no ordering for
  // dictionary-typed values.
  if (stored_v->size() != v.size()) {
    return partial_ordering::unordered;
  }
  for (const auto& it : v) {
    try {
      const auto& item = stored_v->at(it.first);
      if ((*item <=> *it.second) != partial_ordering::equivalent) {
        return partial_ordering::unordered;
      }
    } catch (const out_of_range&) {
      return partial_ordering::unordered;
    }
  }
  // If we get here, then there were the same number of keys in both maps, all
  // keys in v were also in stored_v, and the corresponding values were all
  // equal. Therefore, the overall maps are equivalent.
  return partial_ordering::equivalent;
}